

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corealloc.h
# Opt level: O0

void __thiscall
snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
dealloc_remote_slow<snmalloc::CheckInitPthread>
          (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this,
          PagemapEntry *entry,Alloc<void> p)

{
  LocalState *pLVar1;
  alloc_id_t target_id;
  conditional_t<Config::Options_IsQueueInline,_RemoteAllocator,_RemoteAllocator_*> *this_00;
  undefined8 in_RDX;
  FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
  *this_01;
  ulong *in_RSI;
  CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
  in_RDI;
  undefined8 *in_FS_OFFSET;
  bool sent_something;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  r;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *entry_1;
  address_t in_stack_fffffffffffffe28;
  Alloc<RemoteMessage> in_stack_fffffffffffffe48;
  undefined1 local_170 [8];
  undefined1 *local_168;
  undefined1 local_160 [40];
  undefined1 *local_138;
  ulong local_128;
  FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
  *local_110;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_108;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_f8;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *local_f0;
  ulong local_e8;
  FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
  *local_e0;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_d0;
  SingletonRemoteMessage *local_c8;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  id;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *this_02;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_90;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_88;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  **local_80;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_78;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  **local_70;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_68;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  **local_60;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_58;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_50;
  undefined1 local_48 [8];
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_40;
  undefined1 *local_38;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_30;
  LocalState *local_28;
  LocalState *local_20;
  ulong local_18;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_10;
  undefined1 *local_8;
  
  local_168 = local_170;
  if (*(Alloc **)*in_FS_OFFSET == &ThreadAlloc::default_alloc) {
    ThreadAlloc::CheckInitBase<snmalloc::CheckInitPthread>::
    check_init_slow<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::dealloc_remote_slow<snmalloc::CheckInitPthread>(snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>>const&,snmalloc::CapPtr<void,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>>)::_lambda(snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*,void*)_1_,void*>
              (in_RDX);
  }
  else {
    local_138 = local_160;
    this_01 = (FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
               *)((long)in_RDI.unsafe_capptr + 0x420);
    local_128 = *in_RSI & 0xfffffffffffffffe;
    local_f0 = (RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                *)((long)in_RDI.unsafe_capptr + 0x2048);
    local_e8 = local_128;
    local_e0 = this_01;
    local_108 = (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                 *)freelist::Object::
                   make<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
                             (in_RDI);
    local_8 = &stack0xffffffffffffff50;
    local_80 = &local_88;
    local_110 = this_01;
    local_f8 = local_108;
    id = (BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
          )local_108;
    this_02 = local_f0;
    local_90 = local_108;
    local_88 = local_108;
    local_78 = local_108;
    local_30 = local_108;
    local_10 = local_108;
    pLVar1 = (LocalState *)
             FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
             ::get<false>(this_01,in_stack_fffffffffffffe28);
    local_18 = (pLVar1->object_range).
               super_ContainsParent<snmalloc::LargeBuddyRange<21UL,_21UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_12UL>::Type<snmalloc::StatsRange::Type<snmalloc::CommitRange<snmalloc::PALLinux>::Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<3UL>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_0UL>::Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<2UL>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_14UL>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>_>_>_>_>_>_>_>_>_>_>
               .parent.requested_total;
    local_28 = pLVar1;
    local_20 = pLVar1;
    target_id = RemoteAllocator::trunc_id((RemoteAllocator *)(local_18 & 0xffffffffffffff80));
    local_70 = &local_90;
    local_50 = local_90;
    local_38 = local_48;
    local_58 = local_90;
    local_68 = local_90;
    local_d0 = local_90;
    local_60 = local_70;
    local_40 = local_50;
    local_c8 = (SingletonRemoteMessage *)
               SingletonRemoteMessage::emplace_in_alloc((Alloc<void>)in_RDI.unsafe_capptr);
    RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
    dealloc<11008UL>::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)in_RDI.unsafe_capptr,target_id,in_stack_fffffffffffffe48);
    backend_state_ptr((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                       *)in_RDI.unsafe_capptr);
    this_00 = public_state((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                            *)in_RDI.unsafe_capptr);
    RemoteAllocator::trunc_id(this_00);
    RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::
    post<11008ul>(this_02,pLVar1,(alloc_id_t)id.unsafe_capptr);
  }
  return;
}

Assistant:

SNMALLOC_SLOW_PATH void
    dealloc_remote_slow(const PagemapEntry& entry, capptr::Alloc<void> p)
    {
      CheckInit::check_init(
        [this, &entry, p]() SNMALLOC_FAST_PATH_LAMBDA {
#ifdef SNMALLOC_TRACING
          message<1024>(
            "Remote dealloc post {} ({}, {})",
            p.unsafe_ptr(),
            sizeclass_full_to_size(entry.get_sizeclass()),
            address_cast(entry.get_slab_metadata()));
#endif
          remote_dealloc_cache.template dealloc<sizeof(Allocator)>(
            entry.get_slab_metadata(), p, &entropy);

          post();
        },
        [](Allocator* a, void* p) {
          // Recheck what kind of dealloc we should do in case the allocator
          // we get from lazy_init is the originating allocator.
          a->dealloc(p); // TODO don't double count statistics
        },
        p.unsafe_ptr());
    }